

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O0

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  secp256k1_scalar e_tmp;
  uchar agg_pk32 [32];
  secp256k1_musig_session_internal session_i;
  uchar fin_nonce [32];
  secp256k1_ge aggnonce_pts [2];
  secp256k1_keyagg_cache_internal cache_i;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  secp256k1_keyagg_cache_internal *in_stack_fffffffffffffd40;
  secp256k1_context *in_stack_fffffffffffffd48;
  secp256k1_scalar *in_stack_fffffffffffffd50;
  uchar local_2a8 [24];
  secp256k1_scalar *in_stack_fffffffffffffd70;
  secp256k1_scalar *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  uchar *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  uchar *in_stack_fffffffffffffdd0;
  uchar *in_stack_fffffffffffffdd8;
  secp256k1_scalar *in_stack_fffffffffffffde0;
  uchar *in_stack_fffffffffffffe38;
  uchar *in_stack_fffffffffffffe40;
  secp256k1_ge *in_stack_fffffffffffffe48;
  secp256k1_scalar *in_stack_fffffffffffffe50;
  uchar *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  secp256k1_fe local_128;
  secp256k1_fe asStack_100 [6];
  int local_4;
  
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd40,
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd40,
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd40,
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd40,
               (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_keyagg_cache_load
                      (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,
                       (secp256k1_musig_keyagg_cache *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_fe_impl_get_b32(local_2a8,&local_128);
      iVar1 = secp256k1_musig_aggnonce_load
                        (in_stack_fffffffffffffd48,&in_stack_fffffffffffffd40->pk,
                         (secp256k1_musig_aggnonce *)
                         CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        secp256k1_musig_nonce_process_internal
                  (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        secp256k1_schnorrsig_challenge
                  (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                   in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
        secp256k1_scalar_set_int
                  ((secp256k1_scalar *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
        iVar1 = secp256k1_scalar_is_zero((secp256k1_scalar *)0x10b357);
        if (iVar1 == 0) {
          secp256k1_scalar_mul
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                     in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
          iVar1 = secp256k1_fe_impl_is_odd(asStack_100);
          if (iVar1 != 0) {
            secp256k1_scalar_negate
                      (in_stack_fffffffffffffd50,(secp256k1_scalar *)in_stack_fffffffffffffd48);
          }
        }
        secp256k1_musig_session_save
                  ((secp256k1_musig_session *)in_stack_fffffffffffffd40,
                   (secp256k1_musig_session_internal *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}